

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  Message *pMVar5;
  undefined4 extraout_var;
  LogMessage *pLVar6;
  string *psVar7;
  UnknownFieldSet *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong *puVar9;
  size_type *psVar10;
  long *plVar11;
  FieldDescriptor *pFVar12;
  string serial;
  AggregateErrorCollector collector;
  Parser parser;
  AggregateOptionFinder finder;
  LogFinisher local_119;
  string local_118;
  string local_f8;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Parser local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  MessageLite *this_00;
  
  if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 4) == 0) {
    std::operator+(&local_50,"Option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar8) {
      local_98.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_98.field_2._8_8_ = plVar4[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_98._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_98._M_string_length = plVar4[1];
    *plVar4 = (long)paVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_98,**(ulong **)option_field);
    psVar10 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118.field_2._8_8_ = plVar4[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_118._M_string_length = plVar4[1];
    *plVar4 = (long)psVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
    plVar11 = plVar4 + 2;
    if ((ParseInfoTree **)*plVar4 == (ParseInfoTree **)plVar11) {
      local_78.parse_info_tree_ = (ParseInfoTree *)*plVar11;
      local_78._24_8_ = plVar4[3];
      local_78.error_collector_ = (ErrorCollector *)&local_78.parse_info_tree_;
    }
    else {
      local_78.parse_info_tree_ = (ParseInfoTree *)*plVar11;
      local_78.error_collector_ = (ErrorCollector *)*plVar4;
    }
    local_78.finder_ = (Finder *)plVar4[1];
    *plVar4 = (long)plVar11;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_78,**(ulong **)option_field);
    psVar10 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8.field_2._8_8_ = plVar4[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
    pFVar12 = (FieldDescriptor *)(plVar4 + 2);
    if ((FieldDescriptor *)*plVar4 == pFVar12) {
      local_c0[0]._0_8_ = *(undefined8 *)pFVar12;
      local_c0[0]._8_8_ = plVar4[3];
      local_d0._0_8_ = (FieldDescriptor *)(local_d0 + 0x10);
    }
    else {
      local_c0[0]._0_8_ = *(undefined8 *)pFVar12;
      local_d0._0_8_ = (FieldDescriptor *)*plVar4;
    }
    local_d0._8_8_ = plVar4[1];
    *plVar4 = (long)pFVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_d0);
    if ((FieldDescriptor *)local_d0._0_8_ != (FieldDescriptor *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (local_78.error_collector_ != (ErrorCollector *)&local_78.parse_info_tree_) {
      operator_delete(local_78.error_collector_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    bVar2 = false;
  }
  else {
    if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
      local_d0._0_8_ = option_field;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(option_field + 0x30),FieldDescriptor::TypeOnceInit,
                 (FieldDescriptor **)local_d0);
    }
    pMVar5 = DynamicMessageFactory::GetPrototype
                       (&this->dynamic_factory_,*(Descriptor **)(option_field + 0x68));
    iVar3 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])(pMVar5);
    this_00 = (MessageLite *)CONCAT44(extraout_var,iVar3);
    if (this_00 == (MessageLite *)0x0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_d0,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1b5e);
      pLVar6 = internal::LogMessage::operator<<
                         ((LogMessage *)local_d0,"CHECK failed: dynamic.get() != nullptr: ");
      pLVar6 = internal::LogMessage::operator<<(pLVar6,"Could not create an instance of ");
      local_78.error_collector_ =
           (ErrorCollector *)((ulong)local_78.error_collector_ & 0xffffffffff000000);
      FieldDescriptor::DebugStringWithOptions_abi_cxx11_
                (&local_f8,option_field,(DebugStringOptions *)&local_78);
      pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_f8);
      internal::LogFinisher::operator=((LogFinisher *)&local_118,pLVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      internal::LogMessage::~LogMessage((LogMessage *)local_d0);
    }
    puVar1 = (undefined1 *)((long)&local_f8.field_2 + 8);
    local_f8._M_dataplus._M_p = (pointer)&PTR__AggregateErrorCollector_0066ef30;
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8.field_2._8_8_ = local_f8.field_2._8_8_ & 0xffffffffffffff00;
    local_50._M_dataplus._M_p = (pointer)&PTR__Finder_0066ef78;
    local_50._M_string_length = (size_type)this->builder_;
    local_f8._M_string_length = (size_type)puVar1;
    TextFormat::Parser::Parser(&local_78);
    local_78.error_collector_ = (ErrorCollector *)&local_f8;
    local_78.finder_ = (Finder *)&local_50;
    bVar2 = TextFormat::Parser::ParseFromString
                      (&local_78,(this->uninterpreted_option_->aggregate_value_).ptr_,
                       (Message *)this_00);
    if (bVar2) {
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity =
           local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      MessageLite::SerializeToString(this_00,&local_118);
      if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
        local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_98._M_dataplus._M_p = (pointer)option_field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(option_field + 0x30),(_func_void_FieldDescriptor_ptr **)local_d0,
                   (FieldDescriptor **)&local_98);
      }
      iVar3 = *(int *)(option_field + 0x38);
      if (iVar3 == 0xb) {
        psVar7 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                           (unknown_fields,*(int *)(option_field + 0x44));
        std::__cxx11::string::_M_assign((string *)psVar7);
      }
      else {
        if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
          local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
          local_98._M_dataplus._M_p = (pointer)option_field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(option_field + 0x30),
                     (_func_void_FieldDescriptor_ptr **)local_d0,(FieldDescriptor **)&local_98);
          iVar3 = *(int *)(option_field + 0x38);
        }
        if (iVar3 != 10) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_d0,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1b72);
          pLVar6 = internal::LogMessage::operator<<
                             ((LogMessage *)local_d0,
                              "CHECK failed: (option_field->type()) == (FieldDescriptor::TYPE_GROUP): "
                             );
          internal::LogFinisher::operator=(&local_119,pLVar6);
          internal::LogMessage::~LogMessage((LogMessage *)local_d0);
        }
        this_01 = UnknownFieldSet::AddGroup(unknown_fields,*(int *)(option_field + 0x44));
        UnknownFieldSet::ParseFromArray
                  (this_01,local_118._M_dataplus._M_p,(int)local_118._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    else {
      std::operator+(&local_98,"Error while parsing option value for \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      option_field);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_118.field_2._M_allocated_capacity = *puVar9;
        local_118.field_2._8_8_ = plVar4[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *puVar9;
        local_118._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_118._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_118,local_f8._M_string_length)
      ;
      pFVar12 = (FieldDescriptor *)(plVar4 + 2);
      if ((FieldDescriptor *)*plVar4 == pFVar12) {
        local_c0[0]._0_8_ = *(undefined8 *)pFVar12;
        local_c0[0]._8_8_ = plVar4[3];
        local_d0._0_8_ = (FieldDescriptor *)(local_d0 + 0x10);
      }
      else {
        local_c0[0]._0_8_ = *(undefined8 *)pFVar12;
        local_d0._0_8_ = (FieldDescriptor *)*plVar4;
      }
      local_d0._8_8_ = plVar4[1];
      *plVar4 = (long)pFVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_d0);
      if ((FieldDescriptor *)local_d0._0_8_ != (FieldDescriptor *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
    TextFormat::Parser::~Parser(&local_78);
    TextFormat::Finder::~Finder((Finder *)&local_50);
    local_f8._M_dataplus._M_p = (pointer)&PTR__AggregateErrorCollector_0066ef30;
    if ((undefined1 *)local_f8._M_string_length != puVar1) {
      operator_delete((void *)local_f8._M_string_length);
    }
    io::ErrorCollector::~ErrorCollector((ErrorCollector *)&local_f8);
    if (this_00 != (MessageLite *)0x0) {
      (*this_00->_vptr_MessageLite[1])(this_00);
    }
  }
  return bVar2;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError("Option \"" + option_field->full_name() +
                         "\" is a message. To set the entire message, use "
                         "syntax like \"" +
                         option_field->name() +
                         " = { <proto text format> }\". "
                         "To set fields within it, use "
                         "syntax like \"" +
                         option_field->name() + ".foo = value\".");
  }

  const Descriptor* type = option_field->message_type();
  std::unique_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  GOOGLE_CHECK(dynamic.get() != nullptr)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError("Error while parsing option value for \"" +
                  option_field->name() + "\": " + collector.error_);
    return false;
  } else {
    std::string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      GOOGLE_CHECK_EQ(option_field->type(), FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}